

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int eval_relative_location_path
              (lyxp_expr *exp,uint16_t *exp_idx,lyd_node *cur_node,lys_module *param_4,int all_desc,
              lyxp_set *set,int options)

{
  byte bVar1;
  ushort uVar2;
  LYS_NODE LVar3;
  lyd_node *plVar4;
  lys_node *plVar5;
  ushort uVar6;
  lyxp_set_type lVar7;
  lys_module *plVar8;
  lys_module *plVar9;
  ulong uVar10;
  lyxp_set_node *plVar11;
  char *pcVar12;
  char *pcVar13;
  lyxp_set *set_00;
  lys_node *plVar14;
  lys_node *plVar15;
  lys_node *plVar16;
  int iVar17;
  char *pcVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  lys_module *plVar22;
  lyxp_set_type lVar23;
  ulong uVar24;
  ushort *puVar25;
  ushort *puVar26;
  lyd_node *plVar27;
  ly_ctx *plVar28;
  undefined *puVar29;
  lyxp_node_type lVar30;
  uint uVar31;
  uint uVar32;
  lyxp_set *plVar33;
  lyxp_node_type lVar34;
  lys_module *plVar35;
  ly_ctx *s;
  bool bVar36;
  lys_module *local_a0;
  lyxp_node_type local_94;
  ly_ctx *local_90;
  lys_module *local_88;
  ushort *local_80;
  lys_module *local_78;
  lys_module *local_70;
  lyxp_node_type local_64;
  char cStack_60;
  uint32_t mod_idx;
  lys_module *local_58;
  lys_module *local_50;
  lys_node *local_48;
  char local_39;
  lyxp_set *local_38;
  
  pcVar18 = "parsed";
  if (set == (lyxp_set *)0x0) {
    pcVar18 = "skipped";
  }
  local_39 = (options & 0x1cU) == 0 || set == (lyxp_set *)0x0;
  plVar33 = set;
  local_88 = param_4;
  local_80 = exp_idx;
  local_48 = (lys_node *)cur_node;
  local_38 = set;
  do {
    plVar16 = local_48;
    uVar32 = (uint)set;
    pcVar13 = "eval_node_test";
    switch(exp->tokens[*exp_idx]) {
    case LYXP_TOKEN_DOT:
      if (local_39 == '\0') {
        lVar7 = moveto_snode_self(plVar33,local_48,all_desc,options);
      }
      else {
        lVar7 = moveto_self(plVar33,(lyd_node *)local_48,all_desc,options);
      }
      goto switchD_0017bee8_caseD_0;
    case LYXP_TOKEN_DDOT:
      if (local_39 == '\0') {
        lVar7 = plVar33->type;
        if (lVar7 != LYXP_SET_EMPTY) {
          if (lVar7 != LYXP_SET_SNODE_SET) {
            if (lVar7 - LYXP_SET_NODE_SET < 5) {
              pcVar12 = *(char **)(&DAT_001ced10 + (ulong)(lVar7 - LYXP_SET_NODE_SET) * 8);
            }
            else {
              pcVar12 = (char *)0x0;
            }
            plVar35 = (lys_module *)local_48->module->ctx;
            goto switchD_0017bee8_caseD_2;
          }
          if ((all_desc == 0) ||
             (lVar7 = moveto_snode_self(plVar33,local_48,1,options), lVar7 == LYXP_SET_EMPTY)) {
            local_50 = (lys_module *)moveto_snode_get_root(plVar16,options,&local_64);
            plVar35 = (lys_module *)(long)(int)plVar33->used;
            lVar7 = LYXP_SET_EMPTY;
            if ((long)plVar35 < 1) {
              bVar36 = false;
            }
            else {
              plVar8 = (lys_module *)0x0;
              _cStack_60 = (lys_module *)((ulong)_cStack_60 & 0xffffffff00000000);
              local_58 = plVar35;
              do {
                if ((plVar33->val).nodes[(long)plVar8].pos == 1) {
                  (plVar33->val).nodes[(long)plVar8].pos = 0;
                  if ((plVar33->val).nodes[(long)plVar8].type == LYXP_NODE_ELEM) {
                    plVar35 = (lys_module *)(plVar33->val).nodes[(long)plVar8].node;
                    plVar9 = plVar35;
                    do {
                      plVar9 = (lys_module *)lys_parent((lys_node *)plVar9);
                      if (plVar9 == (lys_module *)0x0) break;
                    } while (((ulong)plVar9->filepath & 0x1642) != 0);
                    if (local_50 == plVar35) {
                      if (((options & 0x18U) == 0) ||
                         (lVar34 = LYXP_NODE_ROOT_CONFIG, plVar9 = plVar35,
                         (local_48->flags & 1) == 0)) {
                        lVar34 = LYXP_NODE_ROOT;
                        plVar9 = plVar35;
                      }
                    }
                    else {
                      lVar34 = LYXP_NODE_ELEM;
                      if (plVar9 == (lys_module *)0x0) {
                        if (((options & 0x18U) == 0) ||
                           (lVar34 = LYXP_NODE_ROOT_CONFIG, (local_48->flags & 1) == 0)) {
                          lVar34 = LYXP_NODE_ROOT;
                        }
                        plVar35 = lys_node_module((lys_node *)plVar35);
                        plVar35 = (lys_module *)
                                  lys_getnext((lys_node *)0x0,(lys_node *)0x0,plVar35,0x100);
                        plVar9 = local_50;
                        if (plVar35 != local_50) {
                          ly_log(local_48->module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                                 ,0x1972);
                          plVar9 = local_50;
                        }
                      }
                    }
                    plVar33 = local_38;
                    if ((lVar34 != LYXP_NODE_ELEM) && ((lVar34 != local_64 || (plVar9 != local_50)))
                       ) {
                      __assert_fail("(new_type == LYXP_NODE_ELEM) || ((new_type == root_type) && (new_node == root))"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                                    ,0x197c,
                                    "int moveto_snode_parent(struct lyxp_set *, struct lys_node *, int, int)"
                                   );
                    }
                    iVar17 = set_snode_insert_node(local_38,(lys_node *)plVar9,lVar34);
                    plVar35 = local_58;
                    if ((long)plVar8 < (long)iVar17 && iVar17 < (int)local_58) {
                      (plVar33->val).nodes[iVar17].pos = 2;
                      _cStack_60 = (lys_module *)CONCAT44(mod_idx,1);
                    }
                  }
                }
                plVar8 = (lys_module *)((long)&plVar8->ctx + 1);
              } while (plVar8 != plVar35);
              bVar36 = _cStack_60 != 0;
            }
            if (bVar36 && 0 < (int)plVar35) {
              lVar19 = 0;
              do {
                if (*(int *)((long)&((plVar33->val).nodes)->pos + lVar19) == 2) {
                  *(undefined4 *)((long)&((plVar33->val).nodes)->pos + lVar19) = 1;
                }
                lVar19 = lVar19 + 0x10;
              } while ((long)plVar35 * 0x10 != lVar19);
            }
          }
        }
        goto switchD_0017bee8_caseD_0;
      }
      lVar7 = LYXP_SET_EMPTY;
      if (plVar33 == (lyxp_set *)0x0) goto switchD_0017bee8_caseD_0;
      plVar35 = (lys_module *)**(undefined8 **)(local_48->name + 0x30);
      lVar7 = plVar33->type;
      pcVar12 = "schema node set";
      switch(lVar7) {
      case LYXP_SET_EMPTY:
        goto switchD_0017bee8_caseD_0;
      case LYXP_SET_NODE_SET:
        local_58 = plVar35;
        if ((all_desc == 0) ||
           (lVar7 = moveto_self(plVar33,(lyd_node *)local_48,1,options), lVar7 == LYXP_SET_EMPTY)) {
          local_50 = (lys_module *)moveto_get_root((lyd_node *)plVar16,options,&local_64);
          if (plVar33->used != 0) {
            uVar10 = 0;
            do {
              lVar34 = (lyxp_node_type)uVar10;
              while( true ) {
                plVar11 = (plVar33->val).nodes;
                plVar35 = (lys_module *)plVar11[uVar10].node;
                lVar30 = plVar11[uVar10].type;
                if (lVar30 == LYXP_NODE_ATTR) break;
                plVar8 = plVar35;
                if (lVar30 == LYXP_NODE_TEXT) goto LAB_0017bf94;
                if (lVar30 == LYXP_NODE_ELEM) {
                  plVar8 = (lys_module *)plVar35->org;
                  goto LAB_0017bf94;
                }
                set_remove_node(plVar33,lVar34);
                if (plVar33->used <= lVar34) goto LAB_0017c0a0;
              }
              plVar8 = (lys_module *)
                       lyd_attr_parent((lyd_node *)local_50,(lyd_attr *)plVar11[uVar10].node);
              if (plVar8 == (lys_module *)0x0) {
                ly_log((ly_ctx *)local_58,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                       ,0x18f8);
                lVar7 = ~LYXP_SET_EMPTY;
                goto switchD_0017bee8_caseD_0;
              }
LAB_0017bf94:
              if ((((options & 2U) != 0) && (plVar8 != (lys_module *)0x0)) &&
                 (((ulong)plVar8->name & 0xe00) == 0x800)) {
                lVar7 = LYXP_SET_NODE_SET;
                goto switchD_0017bee8_caseD_0;
              }
              if (local_50 == plVar35) {
                if ((options == 0) ||
                   (lVar30 = LYXP_NODE_ROOT_CONFIG, plVar8 = plVar35,
                   (local_48->name[0x18] & 1U) == 0)) {
                  lVar30 = LYXP_NODE_ROOT;
                  plVar8 = plVar35;
                }
              }
              else {
                lVar30 = LYXP_NODE_ELEM;
                if (plVar8 == (lys_module *)0x0) {
                  if ((options == 0) ||
                     (lVar30 = LYXP_NODE_ROOT_CONFIG, (local_48->name[0x18] & 1U) == 0)) {
                    lVar30 = LYXP_NODE_ROOT;
                  }
                  do {
                    plVar9 = plVar35;
                    plVar35 = (lys_module *)plVar9->ref;
                  } while (plVar35->dsc != (char *)0x0);
                  plVar8 = local_50;
                  if (plVar9 != local_50) {
                    pcVar13 = 
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                    ;
                    ly_log((ly_ctx *)local_58,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                           ,0x1919);
                    plVar8 = local_50;
                  }
                }
              }
              plVar33 = local_38;
              if ((lVar30 != LYXP_NODE_ELEM) && ((lVar30 != local_64 || (plVar8 != local_50)))) {
                __assert_fail("(new_type == LYXP_NODE_ELEM) || ((new_type == root_type) && (new_node == root))"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                              ,0x1923,
                              "int moveto_parent(struct lyxp_set *, struct lyd_node *, int, int)");
              }
              iVar17 = set_dup_node_check(local_38,(lyd_node *)plVar8,lVar30,-1);
              if (iVar17 == 0) {
                set_replace_node(plVar33,(lyd_node *)plVar8,lVar30,lVar34,(uint32_t)pcVar13);
                uVar10 = (ulong)(lVar34 + LYXP_NODE_ROOT_CONFIG);
              }
              else {
                set_remove_node(plVar33,lVar34);
              }
            } while ((uint)uVar10 < plVar33->used);
          }
LAB_0017c0a0:
          iVar17 = set_sort(plVar33,(lyd_node *)local_48,options);
          if (iVar17 != 0) {
LAB_0017da04:
            __assert_fail("!set_sort(set, cur_node, options) && !set_sorted_dup_node_clean(set)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                          ,0x192d,
                          "int moveto_parent(struct lyxp_set *, struct lyd_node *, int, int)");
          }
          lVar7 = LYXP_SET_EMPTY;
          if (1 < plVar33->used) {
            bVar36 = false;
            uVar10 = 0;
            do {
              plVar11 = (plVar33->val).nodes;
              uVar32 = (int)uVar10 + 1;
              uVar24 = (ulong)uVar32;
              if ((plVar11[uVar10].node == plVar11[uVar24].node) &&
                 (plVar11[uVar10].type == plVar11[uVar24].type)) {
                set_remove_node(plVar33,uVar32);
                bVar36 = true;
                uVar24 = uVar10;
              }
              uVar10 = uVar24;
            } while ((uint)uVar24 < plVar33->used - 1);
            lVar7 = LYXP_SET_EMPTY;
            if (bVar36) goto LAB_0017da04;
          }
        }
        goto switchD_0017bee8_caseD_0;
      case LYXP_SET_SNODE_SET:
        break;
      case LYXP_SET_BOOLEAN:
        pcVar12 = "boolean";
        break;
      case LYXP_SET_NUMBER:
        pcVar12 = "number";
        break;
      case LYXP_SET_STRING:
        pcVar12 = "string";
        break;
      default:
        pcVar12 = (char *)0x0;
      }
switchD_0017bee8_caseD_2:
      ly_vlog((ly_ctx *)plVar35,LYE_XPATH_INOP_1,LY_VLOG_NONE,(void *)0x0,"path operator",pcVar12);
      lVar7 = ~LYXP_SET_EMPTY;
switchD_0017bee8_caseD_0:
      puVar25 = local_80;
      if (lVar7 != LYXP_SET_EMPTY) {
        return lVar7;
      }
      pcVar13 = print_token(exp->tokens[*local_80]);
      ly_log_dbg(8,"%-27s %s %s[%u]","eval_relative_location_path",pcVar18,pcVar13,
                 (ulong)exp->expr_pos[*puVar25]);
      *puVar25 = *puVar25 + 1;
      puVar26 = local_80;
      goto LAB_0017ca6f;
    case LYXP_TOKEN_AT:
      uVar32 = (uint)exp->expr_pos[*exp_idx];
      bVar36 = false;
      ly_log_dbg(8,"%-27s %s %s[%u]","eval_relative_location_path",pcVar18,"@");
      *exp_idx = *exp_idx + 1;
      break;
    default:
      if (local_88 == (lys_module *)0x0) {
        plVar28 = (ly_ctx *)0x0;
      }
      else {
        plVar28 = local_88->ctx;
      }
      ly_log(plVar28,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
             ,0x1c47);
      return -1;
    case LYXP_TOKEN_NAMETEST:
    case LYXP_TOKEN_NODETYPE:
      bVar36 = true;
    }
    plVar16 = local_48;
    uVar6 = *local_80;
    if (exp->tokens[uVar6] == LYXP_TOKEN_NODETYPE) {
      pcVar13 = "skipped";
      if (plVar33 != (lyxp_set *)0x0) {
        if (exp->tok_len[uVar6] != 4) {
          __assert_fail("exp->tok_len[*exp_idx] == 4",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                        ,0x1b0e,
                        "int eval_node_test(struct lyxp_expr *, uint16_t *, struct lyd_node *, struct lys_module *, int, int, struct lyxp_set *, int)"
                       );
        }
        lVar7 = local_38->type;
        if (lVar7 == LYXP_SET_SNODE_SET) {
          uVar32 = local_38->used;
          pcVar13 = "skipped";
          if ((ulong)uVar32 != 0) {
            lVar19 = 0;
            do {
              if (*(int *)((long)&((local_38->val).nodes)->pos + lVar19) == 1) {
                *(undefined4 *)((long)&((local_38->val).nodes)->pos + lVar19) = 0;
              }
              lVar19 = lVar19 + 0x10;
            } while ((ulong)uVar32 << 4 != lVar19);
            pcVar13 = "skipped";
          }
        }
        else {
          uVar6 = exp->expr_pos[uVar6];
          pcVar13 = exp->expr;
          iVar17 = strncmp(pcVar13 + uVar6,"node",4);
          if (iVar17 == 0) {
            if ((options & 0x1cU) == 0) {
              pcVar13 = "parsed";
              if (lVar7 != LYXP_SET_NODE_SET) {
                lyxp_set_cast(local_38,LYXP_SET_EMPTY,(lyd_node *)plVar16,local_88,options);
                goto LAB_0017cb1f;
              }
            }
            else {
              uVar32 = local_38->used;
              pcVar13 = "parsed";
              if ((ulong)uVar32 != 0) {
                lVar19 = 0;
                do {
                  if (*(int *)((long)&((local_38->val).nodes)->pos + lVar19) == 1) {
                    *(undefined4 *)((long)&((local_38->val).nodes)->pos + lVar19) = 0;
                  }
                  lVar19 = lVar19 + 0x10;
                } while ((ulong)uVar32 << 4 != lVar19);
LAB_0017cb1f:
                pcVar13 = "parsed";
              }
            }
          }
          else {
            iVar17 = strncmp(pcVar13 + uVar6,"text",4);
            plVar33 = local_38;
            if (iVar17 != 0) {
              __assert_fail("!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], \"text\", 4)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                            ,0x1b19,
                            "int eval_node_test(struct lyxp_expr *, uint16_t *, struct lyd_node *, struct lys_module *, int, int, struct lyxp_set *, int)"
                           );
            }
            if ((options & 0x1cU) == 0) {
              pcVar13 = "parsed";
              if (lVar7 != LYXP_SET_EMPTY) {
                if (lVar7 != LYXP_SET_NODE_SET) {
                  if (lVar7 - LYXP_SET_SNODE_SET < 4) {
                    puVar29 = (&PTR_anon_var_dwarf_771a3_001ced38)[lVar7 - LYXP_SET_SNODE_SET];
                  }
                  else {
                    puVar29 = (undefined *)0x0;
                  }
                  ly_vlog(local_88->ctx,LYE_XPATH_INCTX,LY_VLOG_NONE,(void *)0x0,puVar29,"text()");
                  lVar7 = ~LYXP_SET_EMPTY;
                  puVar26 = local_80;
                  plVar16 = local_48;
                  plVar33 = local_38;
                  goto joined_r0x0017d0c3;
                }
                pcVar13 = "parsed";
                if (local_38->used != 0) {
                  uVar10 = 0;
                  do {
                    lVar34 = (plVar33->val).nodes[uVar10].type;
                    if (lVar34 < (LYXP_NODE_ATTR|LYXP_NODE_ROOT_CONFIG)) {
                      if (lVar34 == LYXP_NODE_ELEM) {
                        plVar11 = (plVar33->val).nodes + uVar10;
                        plVar27 = plVar11->node;
                        if ((char)plVar27->validity < '\0') {
                          ly_vlog(local_88->ctx,LYE_XPATH_DUMMY,LY_VLOG_LYD,plVar27,
                                  plVar27->schema->name);
                          goto LAB_0017c560;
                        }
                        if (((plVar27->schema->nodetype & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN)
                           && (plVar27->ht != (hash_table *)0x0)) {
                          plVar11->type = LYXP_NODE_TEXT;
                          uVar10 = (ulong)((uint32_t)uVar10 + 1);
                          goto LAB_0017c9aa;
                        }
                      }
                      set_remove_node(plVar33,(uint32_t)uVar10);
                    }
LAB_0017c9aa:
                  } while ((uint)uVar10 < plVar33->used);
                  goto LAB_0017cb1f;
                }
              }
            }
            else {
              uVar32 = local_38->used;
              pcVar13 = "parsed";
              if ((ulong)uVar32 != 0) {
                lVar19 = 0;
                do {
                  if (*(int *)((long)&((local_38->val).nodes)->pos + lVar19) == 1) {
                    *(undefined4 *)((long)&((local_38->val).nodes)->pos + lVar19) = 0;
                  }
                  lVar19 = lVar19 + 0x10;
                } while ((ulong)uVar32 << 4 != lVar19);
                goto LAB_0017cb1f;
              }
            }
          }
        }
      }
      puVar26 = local_80;
      pcVar12 = print_token(exp->tokens[*local_80]);
      ly_log_dbg(8,"%-27s %s %s[%u]","eval_node_test",pcVar13,pcVar12,(ulong)exp->expr_pos[*puVar26]
                );
      uVar6 = *puVar26 + 1;
      *puVar26 = uVar6;
      if (exp->tokens[uVar6] != LYXP_TOKEN_PAR1) {
        __assert_fail("exp->tokens[*exp_idx] == LYXP_TOKEN_PAR1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                      ,0x1b25,
                      "int eval_node_test(struct lyxp_expr *, uint16_t *, struct lyd_node *, struct lys_module *, int, int, struct lyxp_set *, int)"
                     );
      }
      ly_log_dbg(8,"%-27s %s %s[%u]","eval_node_test",pcVar13,"(",(ulong)exp->expr_pos[uVar6]);
      uVar6 = *puVar26 + 1;
      *puVar26 = uVar6;
      if (exp->tokens[uVar6] != LYXP_TOKEN_PAR2) {
        __assert_fail("exp->tokens[*exp_idx] == LYXP_TOKEN_PAR2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                      ,0x1b2b,
                      "int eval_node_test(struct lyxp_expr *, uint16_t *, struct lyd_node *, struct lys_module *, int, int, struct lyxp_set *, int)"
                     );
      }
      ly_log_dbg(8,"%-27s %s %s[%u]","eval_node_test",pcVar13,")",(ulong)exp->expr_pos[uVar6]);
      puVar26 = local_80;
      plVar33 = local_38;
LAB_0017d0b8:
      *puVar26 = *puVar26 + 1;
      lVar7 = LYXP_SET_EMPTY;
      puVar26 = local_80;
      plVar16 = local_48;
    }
    else if (exp->tokens[uVar6] == LYXP_TOKEN_NAMETEST) {
      uVar31 = (uint)uVar6;
      if (bVar36) {
        if (all_desc == 0) {
          if (local_39 != '\0') {
            uVar10 = (ulong)((uint)uVar6 * 2);
            lVar7 = moveto_node(plVar33,(lyd_node *)local_48,
                                exp->expr + *(ushort *)((long)exp->expr_pos + uVar10),
                                *(uint16_t *)((long)exp->tok_len + uVar10),options);
            goto LAB_0017ccd0;
          }
          if (plVar33->type == LYXP_SET_EMPTY) goto LAB_0017c932;
          plVar28 = local_48->module->ctx;
          pcVar13 = "node set";
          switch(plVar33->type) {
          case LYXP_SET_NODE_SET:
            break;
          case LYXP_SET_SNODE_SET:
            uVar10 = (ulong)((uint)uVar6 * 2);
            s = (ly_ctx *)(exp->expr + *(ushort *)((long)exp->expr_pos + uVar10));
            uVar6 = *(ushort *)((long)exp->tok_len + uVar10);
            uVar32 = (uint)uVar6;
            local_90 = plVar28;
            moveto_snode_get_root(local_48,options,&local_94);
            iVar17 = (int)pcVar13;
            pcVar13 = strnchr((char *)s,0x3a,uVar32);
            plVar28 = local_90;
            if (pcVar13 == (char *)0x0) {
              if ((uVar6 == 1) && (*(char *)&(s->dict).hash_tab == '*')) {
                local_70 = (lys_module *)0x0;
              }
              else {
                local_70 = lys_node_module(local_48);
              }
            }
            else {
              local_50 = (lys_module *)CONCAT44(local_50._4_4_,uVar32);
              uVar32 = (int)pcVar13 - (int)s;
              plVar35 = moveto_resolve_model((char *)s,(uint16_t)uVar32,local_90,local_48,1,iVar17);
              if (plVar35 == (lys_module *)0x0) goto LAB_0017d563;
              s = (ly_ctx *)((long)&(s->dict).hash_tab + (long)(int)uVar32 + 1);
              uVar32 = ~uVar32 + (uint)local_50;
              local_70 = plVar35;
            }
            plVar33 = local_38;
            pcVar13 = lydict_insert(local_90,(char *)s,(ulong)(uVar32 & 0xffff));
            local_58 = (lys_module *)(long)(int)plVar33->used;
            lVar7 = LYXP_SET_EMPTY;
            if ((long)local_58 < 1) {
              bVar36 = false;
            }
            else {
              plVar8 = (lys_module *)0x0;
              _cStack_60 = (lys_module *)((ulong)_cStack_60 & 0xffffffff00000000);
              plVar35 = local_70;
              do {
                plVar9 = plVar35;
                local_50 = plVar8;
                if ((local_38->val).nodes[(long)plVar8].pos == 1) {
                  (local_38->val).nodes[(long)plVar8].pos = 0;
                  if ((local_38->val).nodes[(long)plVar8].type < LYXP_NODE_ELEM) {
                    local_64 = LYXP_NODE_ROOT;
                    do {
                      plVar9 = plVar35;
                      if ((plVar35 == (lys_module *)0x0) &&
                         (plVar9 = ly_ctx_get_module_iter(local_90,&local_64),
                         plVar9 == (lys_module *)0x0)) {
                        plVar9 = (lys_module *)0x0;
                        break;
                      }
                      for (plVar16 = lys_getnext((lys_node *)0x0,(lys_node *)0x0,plVar9,0x100);
                          plVar16 != (lys_node *)0x0;
                          plVar16 = lys_getnext(plVar16,(lys_node *)0x0,plVar9,0x100)) {
                        iVar17 = moveto_snode_check(plVar16,local_94,pcVar13,plVar9,options);
                        if (iVar17 == 0) {
                          iVar17 = set_snode_insert_node(local_38,plVar16,LYXP_NODE_ELEM);
                          if ((long)local_50 < (long)iVar17 && iVar17 < (int)local_58) {
                            (local_38->val).nodes[iVar17].pos = 2;
                            _cStack_60 = (lys_module *)CONCAT44(mod_idx,1);
                          }
                        }
                      }
                      plVar35 = (lys_module *)0x0;
                    } while (local_64 != LYXP_NODE_ROOT);
                  }
                  else {
                    plVar8 = (lys_module *)(local_38->val).nodes[(long)plVar8].node;
                    if (((ulong)plVar8->filepath & 0x802c) == 0) {
                      local_70 = plVar35;
                      if (plVar35 == (lys_module *)0x0) {
                        plVar35 = lys_node_module(local_48);
                        bVar1 = plVar35->field_0x40;
                      }
                      else {
                        bVar1 = plVar35->field_0x40;
                      }
                      if ((bVar1 & 0x80) != 0) {
                        local_a0 = (lys_module *)0x0;
                        plVar35 = (lys_module *)0x0;
                        goto LAB_0017d785;
                      }
                      local_a0 = local_70;
                      if (local_70 == (lys_module *)0x0) {
                        local_a0 = lys_node_module(local_48);
                      }
                      plVar35 = (lys_module *)0x0;
                      do {
                        plVar35 = (lys_module *)
                                  lys_getnext_target_aug
                                            ((lys_node_augment *)plVar35,local_a0,(lys_node *)plVar8
                                            );
LAB_0017d785:
                        local_78 = plVar35;
                        if (plVar35 == (lys_module *)0x0) {
                          local_78 = plVar8;
                        }
                        plVar16 = lys_getnext((lys_node *)0x0,(lys_node *)local_78,(lys_module *)0x0
                                              ,0x100);
                        lVar34 = local_94;
                        plVar9 = local_70;
                        while (local_94 = lVar34, local_70 = plVar9, plVar16 != (lys_node *)0x0) {
                          if (plVar9 == (lys_module *)0x0) {
                            plVar9 = lys_node_module(local_48);
                          }
                          iVar17 = moveto_snode_check(plVar16,lVar34,pcVar13,plVar9,options);
                          if (iVar17 == 0) {
                            iVar17 = set_snode_insert_node(local_38,plVar16,LYXP_NODE_ELEM);
                            if ((long)local_50 < (long)iVar17 && iVar17 < (int)local_58) {
                              (local_38->val).nodes[iVar17].pos = 2;
                              _cStack_60 = (lys_module *)CONCAT44(mod_idx,1);
                            }
                          }
                          plVar16 = lys_getnext(plVar16,(lys_node *)local_78,(lys_module *)0x0,0x100
                                               );
                          lVar34 = local_94;
                          plVar9 = local_70;
                        }
                      } while (plVar35 != (lys_module *)0x0);
                    }
                  }
                }
                plVar35 = plVar9;
                plVar8 = (lys_module *)((long)&local_50->ctx + 1);
              } while (plVar8 != local_58);
              bVar36 = _cStack_60 != 0;
            }
            lydict_remove(local_90,pcVar13);
            plVar33 = local_38;
            if ((0 < (int)local_58) && (bVar36)) {
              local_58 = (lys_module *)((long)local_58 << 4);
              lVar19 = 0;
              do {
                if (*(int *)((long)&((local_38->val).nodes)->pos + lVar19) == 2) {
                  *(undefined4 *)((long)&((local_38->val).nodes)->pos + lVar19) = 1;
                }
                lVar19 = lVar19 + 0x10;
                lVar7 = LYXP_SET_EMPTY;
              } while (local_58 != (lys_module *)lVar19);
            }
            goto LAB_0017ccd0;
          case LYXP_SET_BOOLEAN:
            pcVar13 = "boolean";
            break;
          case LYXP_SET_NUMBER:
            pcVar13 = "number";
            break;
          case LYXP_SET_STRING:
            pcVar13 = "string";
            break;
          default:
            pcVar13 = (char *)0x0;
          }
switchD_0017c894_caseD_1:
          ly_vlog(plVar28,LYE_XPATH_INOP_1,LY_VLOG_NONE,(void *)0x0,"path operator",pcVar13);
          lVar7 = ~LYXP_SET_EMPTY;
        }
        else if (local_39 == '\0') {
          if (plVar33->type != LYXP_SET_EMPTY) {
            plVar28 = local_48->module->ctx;
            pcVar13 = "node set";
            switch(plVar33->type) {
            case LYXP_SET_NODE_SET:
              break;
            case LYXP_SET_SNODE_SET:
              plVar35 = (lys_module *)exp->expr_pos;
              s = (ly_ctx *)
                  (exp->expr + *(ushort *)(plVar35->padding2 + ((ulong)(uVar31 * 2) - 0x42)));
              uVar6 = *(ushort *)((long)exp->tok_len + (ulong)(uVar31 * 2));
              local_50 = (lys_module *)CONCAT44(local_50._4_4_,(uint)uVar6);
              moveto_snode_get_root(local_48,options,&local_64);
              iVar17 = (int)pcVar13;
              pcVar13 = strnchr((char *)s,0x3a,(uint)uVar6);
              if (pcVar13 == (char *)0x0) {
                plVar8 = (lys_module *)0x0;
                uVar32 = (uint)local_50;
              }
              else {
                pcVar13 = strnchr((char *)s,0x3a,(uint)uVar6);
                uVar32 = (int)pcVar13 - (int)s;
                plVar8 = moveto_resolve_model((char *)s,(uint16_t)uVar32,plVar28,local_48,1,iVar17);
                if (plVar8 == (lys_module *)0x0) {
LAB_0017d563:
                  ly_vlog(plVar28,LYE_XPATH_INMOD,LY_VLOG_NONE,(void *)0x0,(ulong)uVar32,s);
                  lVar7 = ~LYXP_SET_EMPTY;
                  plVar33 = local_38;
                  goto LAB_0017ccd0;
                }
                s = (ly_ctx *)((long)&(s->dict).hash_tab + (long)(int)uVar32 + 1);
                plVar35 = plVar8;
                uVar32 = ~uVar32 + (uint)local_50;
              }
              plVar9 = _cStack_60;
              lVar7 = LYXP_SET_EMPTY;
              _cStack_60 = (lys_module *)((ulong)_cStack_60 & 0xffffffff00000000);
              if ((short)uVar32 == 1) {
                mod_idx = SUB84(plVar9,4);
                _cStack_60 = (lys_module *)
                             CONCAT44(mod_idx,(int)CONCAT71((int7)((ulong)plVar35 >> 8),
                                                            *(char *)&(s->dict).hash_tab == '*'));
              }
              local_78 = (lys_module *)(long)(int)local_38->used;
              plVar33 = local_38;
              if (0 < (long)local_78) {
                local_70 = (lys_module *)(ulong)(uVar32 & 0xffff);
                plVar35 = (lys_module *)0x0;
                plVar9 = (lys_module *)0x0;
                local_90 = s;
                do {
                  local_58 = plVar9;
                  local_50 = plVar35;
                  if ((local_38->val).nodes[(long)plVar9].pos == 1) {
                    (local_38->val).nodes[(long)plVar9].pos = 0;
                    plVar16 = (lys_node *)(local_38->val).nodes[(long)plVar9].node;
                    plVar5 = plVar16;
                    while (plVar5 != (lys_node *)0x0) {
                      plVar15 = plVar5;
                      if ((local_64 == LYXP_NODE_ROOT_CONFIG) && ((plVar5->flags & 2) != 0))
                      goto LAB_0017d335;
                      LVar3 = plVar5->nodetype;
                      if ((int)LVar3 < 0x400) {
                        if ((LVar3 != LYS_CHOICE) && (LVar3 != LYS_CASE)) {
                          if (LVar3 == LYS_INPUT) {
                            if ((options & 0x20U) != 0) goto LAB_0017d335;
                          }
                          else {
LAB_0017d20b:
                            bVar36 = plVar5 != plVar16;
                            if (bVar36 && cStack_60 == '\0') {
                              plVar9 = lys_node_module(plVar5);
                              plVar35 = plVar8;
                              if (plVar8 == (lys_module *)0x0) {
                                plVar35 = lys_node_module(local_48);
                              }
                              bVar36 = bVar36 && plVar9 == plVar35;
                            }
                            if (bVar36 && cStack_60 == '\0') {
                              pcVar13 = plVar5->name;
                              iVar17 = strncmp(pcVar13,(char *)local_90,(size_t)local_70);
                              if ((iVar17 == 0) && (pcVar13[(long)local_70] == '\0')) {
                                bVar36 = true;
                              }
                              else {
                                bVar36 = false;
                              }
                            }
                            if (bVar36) {
                              uVar32 = 0xffffffff;
                              if ((ulong)local_38->used != 0) {
                                plVar35 = (lys_module *)0x0;
                                uVar31 = 0;
                                do {
                                  uVar32 = uVar31;
                                  if (((local_50 != plVar35) &&
                                      (*(lys_node **)
                                        (plVar35->padding2 +
                                        (long)((long)&(local_38->val).nodes[-5].pos + 2)) == plVar5)
                                      ) && (*(int *)((long)&((local_38->val).nodes)->type +
                                                    (long)plVar35) == 2)) break;
                                  uVar31 = uVar32 + 1;
                                  plVar35 = (lys_module *)&plVar35->prefix;
                                  uVar32 = 0xffffffff;
                                } while ((lys_module *)((ulong)local_38->used << 4) != plVar35);
                              }
                              if ((int)uVar32 < 0) {
                                set_snode_insert_node(local_38,plVar5,LYXP_NODE_ELEM);
                              }
                              else {
                                (local_38->val).nodes[(long)(ulong)uVar32].pos = 1;
                                if (local_58 < (lys_module *)(ulong)uVar32) goto LAB_0017d335;
                              }
                            }
                          }
                        }
LAB_0017d31b:
                        if ((plVar5->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN)
                        {
                          plVar14 = plVar5->child;
                        }
                        else {
                          plVar14 = (lys_node *)0x0;
                        }
                        if (plVar14 == (lys_node *)0x0) goto LAB_0017d335;
                      }
                      else {
                        if (LVar3 == LYS_OUTPUT) {
                          if ((options & 0x20U) != 0) goto LAB_0017d31b;
                        }
                        else if (LVar3 != LYS_GROUPING) {
                          if (LVar3 != LYS_USES) goto LAB_0017d20b;
                          goto LAB_0017d31b;
                        }
LAB_0017d335:
                        if (plVar5 == plVar16) break;
                        plVar14 = plVar5->next;
                      }
                      while ((plVar5 = plVar14, plVar5 == (lys_node *)0x0 &&
                             (plVar14 = lys_parent(plVar15), plVar14 != plVar16))) {
                        plVar15 = lys_parent(plVar15);
                        plVar14 = plVar15->next;
                      }
                    }
                  }
                  plVar9 = (lys_module *)((long)&local_58->ctx + 1);
                  plVar35 = (lys_module *)&local_50->prefix;
                  plVar33 = local_38;
                } while (plVar9 != local_78);
              }
              goto LAB_0017ccd0;
            case LYXP_SET_BOOLEAN:
              pcVar13 = "boolean";
              break;
            case LYXP_SET_NUMBER:
              pcVar13 = "number";
              break;
            case LYXP_SET_STRING:
              pcVar13 = "string";
              break;
            default:
              pcVar13 = (char *)0x0;
            }
            goto switchD_0017c894_caseD_1;
          }
LAB_0017c932:
          lVar7 = LYXP_SET_EMPTY;
        }
        else {
          lVar7 = moveto_node_alldesc(plVar33,(lyd_node *)local_48,
                                      exp->expr +
                                      *(ushort *)((long)exp->expr_pos + (ulong)((uint)uVar6 * 2)),
                                      *(uint16_t *)((long)exp->tok_len + (ulong)((uint)uVar6 * 2)),
                                      options);
        }
LAB_0017ccd0:
        if ((plVar33 != (lyxp_set *)0x0 && (options & 0x1cU) != 0) && lVar7 == LYXP_SET_EMPTY) {
          uVar32 = plVar33->used;
          iVar17 = uVar32 - 1;
          if (-2 < iVar17) {
            iVar17 = -1;
          }
          iVar20 = uVar32 + 1;
          do {
            uVar32 = uVar32 - 1;
            iVar21 = iVar17 + 1;
            if ((int)uVar32 < 0) break;
            iVar20 = iVar20 + -1;
            iVar21 = iVar20;
          } while ((plVar33->val).nodes[uVar32 & 0x7fffffff].pos == 0);
          lVar7 = LYXP_SET_EMPTY;
          if (iVar21 == 0) {
            pcVar13 = lys_path(local_48,1);
            uVar6 = *(ushort *)((long)exp->tok_len + (ulong)((uint)*local_80 * 2));
            uVar2 = *(ushort *)((long)exp->expr_pos + (ulong)((uint)*local_80 * 2));
            ly_log(local_88->ctx,LY_LLWRN,LY_SUCCESS,
                   "Schema node \"%.*s\" not found (%.*s) with context node \"%s\".",(ulong)uVar6,
                   exp->expr + uVar2,(ulong)((uint)uVar2 + (uint)uVar6),exp->expr,pcVar13);
            plVar33 = local_38;
            free(pcVar13);
            lVar7 = LYXP_SET_EMPTY;
          }
        }
      }
      else if (local_39 == '\0') {
        uVar32 = plVar33->used;
        lVar7 = LYXP_SET_EMPTY;
        if ((ulong)uVar32 != 0) {
          lVar19 = 0;
          do {
            if (*(int *)((long)&((plVar33->val).nodes)->pos + lVar19) == 1) {
              *(undefined4 *)((long)&((plVar33->val).nodes)->pos + lVar19) = 0;
            }
            lVar19 = lVar19 + 0x10;
          } while ((ulong)uVar32 << 4 != lVar19);
        }
      }
      else {
        lVar23 = LYXP_SET_EMPTY;
        if (all_desc == 0) {
          lVar7 = lVar23;
          if ((plVar33 != (lyxp_set *)0x0) && (lVar7 = plVar33->type, lVar7 != LYXP_SET_EMPTY)) {
            if (lVar7 != LYXP_SET_NODE_SET) {
              if (lVar7 - LYXP_SET_SNODE_SET < 4) {
                puVar29 = (&PTR_anon_var_dwarf_771a3_001ced38)[lVar7 - LYXP_SET_SNODE_SET];
              }
              else {
                puVar29 = (undefined *)0x0;
              }
              pcVar13 = local_48->name;
              goto LAB_0017d014;
            }
            plVar35 = (lys_module *)
                      (exp->expr + *(ushort *)((long)exp->expr_pos + (ulong)(uVar31 * 2)));
            uVar6 = *(ushort *)((long)exp->tok_len + (ulong)(uVar31 * 2));
            local_50 = (lys_module *)CONCAT44(local_50._4_4_,(uint)uVar6);
            pcVar13 = strnchr((char *)plVar35,0x3a,(uint)uVar6);
            if ((local_48 == (lys_node *)0x0) || (pcVar13 == (char *)0x0)) {
              plVar8 = (lys_module *)0x0;
              uVar32 = (uint)local_50;
            }
            else {
              pcVar13 = strnchr((char *)plVar35,0x3a,(uint)uVar6);
              uVar31 = (int)pcVar13 - (int)plVar35;
              plVar8 = moveto_resolve_model
                                 ((char *)plVar35,(uint16_t)uVar31,
                                  (ly_ctx *)**(undefined8 **)(local_48->name + 0x30),(lys_node *)0x0
                                  ,0,uVar32);
              if (plVar8 == (lys_module *)0x0) goto LAB_0017ce40;
              plVar35 = (lys_module *)(plVar35->padding2 + (long)(int)uVar31 + -0x41);
              uVar32 = ~uVar31 + (uint)local_50;
            }
            local_50 = (lys_module *)CONCAT71(local_50._1_7_,1);
            if ((short)uVar32 == 1) {
              local_50 = (lys_module *)CONCAT71(local_50._1_7_,*(char *)&plVar35->ctx != '*');
            }
            plVar33 = local_38;
            lVar7 = lVar23;
            if (local_38->used != 0) {
              plVar9 = (lys_module *)(ulong)(uVar32 & 0xffff);
              plVar22 = (lys_module *)0x0;
              local_78 = plVar8;
              local_70 = plVar9;
              _cStack_60 = plVar35;
              do {
                bVar36 = true;
                if ((((plVar33->val).nodes[(ulong)plVar22 & 0xffffffff].type == LYXP_NODE_ELEM) &&
                    (plVar27 = (plVar33->val).nodes[(ulong)plVar22 & 0xffffffff].node,
                    -1 < (char)plVar27->validity)) &&
                   (plVar27 = (lyd_node *)plVar27->attr, plVar27 != (lyd_node *)0x0)) {
                  bVar36 = false;
                  do {
                    if ((plVar8 == (lys_module *)0x0) ||
                       (*(lys_module **)&plVar27->attr->value_type == plVar8)) {
                      if ((char)local_50 != '\0') {
                        plVar4 = plVar27->next;
                        local_58 = plVar22;
                        iVar17 = strncmp((char *)plVar4,(char *)plVar35,(size_t)plVar9);
                        plVar8 = local_78;
                        plVar35 = _cStack_60;
                        plVar33 = local_38;
                        plVar22 = local_58;
                        if ((iVar17 != 0) ||
                           (plVar9->padding2[(long)((long)&plVar4[-1].schema + 6)] != '\0'))
                        goto LAB_0017cfa5;
                      }
                      uVar10 = (ulong)plVar22 & 0xffffffff;
                      if (bVar36) {
                        set_insert_node(plVar33,plVar27,(plVar33->val).nodes[uVar10].pos,
                                        LYXP_NODE_ATTR,(int)plVar22 + 1);
                        plVar8 = local_78;
                        plVar9 = local_70;
                        plVar35 = _cStack_60;
                      }
                      else {
                        (plVar33->val).nodes[uVar10].node = plVar27;
                        (plVar33->val).nodes[uVar10].type = LYXP_NODE_ATTR;
                      }
                      bVar36 = true;
                      plVar22 = (lys_module *)(ulong)((int)plVar22 + 1);
                    }
LAB_0017cfa5:
                    plVar27 = *(lyd_node **)&plVar27->validity;
                  } while (plVar27 != (lyd_node *)0x0);
                  bVar36 = !bVar36;
                }
                if (bVar36) {
                  set_remove_node(plVar33,(uint)plVar22);
                  plVar8 = local_78;
                  plVar9 = local_70;
                  plVar35 = _cStack_60;
                }
                lVar7 = LYXP_SET_EMPTY;
              } while ((uint)plVar22 < plVar33->used);
            }
          }
        }
        else {
          lVar7 = LYXP_SET_EMPTY;
          if ((plVar33 != (lyxp_set *)0x0) && (lVar7 = plVar33->type, lVar7 != LYXP_SET_EMPTY)) {
            if (lVar7 == LYXP_SET_NODE_SET) {
              plVar35 = (lys_module *)
                        (exp->expr + *(ushort *)((long)exp->expr_pos + (ulong)(uVar31 * 2)));
              uVar6 = *(ushort *)((long)exp->tok_len + (ulong)(uVar31 * 2));
              _cStack_60 = (lys_module *)CONCAT44(mod_idx,(uint)uVar6);
              pcVar13 = strnchr((char *)plVar35,0x3a,(uint)uVar6);
              if (pcVar13 == (char *)0x0) {
                local_78 = (lys_module *)0x0;
                local_58 = plVar35;
              }
              else {
                pcVar13 = strnchr((char *)plVar35,0x3a,(uint)uVar6);
                uVar31 = (int)pcVar13 - (int)plVar35;
                plVar8 = moveto_resolve_model
                                   ((char *)plVar35,(uint16_t)uVar31,
                                    (ly_ctx *)**(undefined8 **)(local_48->name + 0x30),
                                    (lys_node *)0x0,0,uVar32);
                if (plVar8 == (lys_module *)0x0) {
LAB_0017ce40:
                  ly_vlog((ly_ctx *)**(undefined8 **)(local_48->name + 0x30),LYE_XPATH_INMOD,
                          LY_VLOG_NONE,(void *)0x0,(ulong)uVar31,plVar35);
                  lVar7 = ~LYXP_SET_EMPTY;
                  plVar33 = local_38;
                  goto LAB_0017d071;
                }
                _cStack_60 = (lys_module *)CONCAT44(mod_idx,~uVar31 + _cStack_60);
                local_78 = plVar8;
                local_58 = (lys_module *)(plVar35->padding2 + (long)(int)uVar31 + -0x41);
              }
              set_00 = set_copy(local_38);
              plVar16 = local_48;
              lVar7 = moveto_node_alldesc(set_00,(lyd_node *)local_48,"*",1,options);
              if (lVar7 == LYXP_SET_EMPTY) {
                iVar17 = moveto_union(local_38,set_00,(lyd_node *)plVar16,options);
                if (iVar17 == 0) {
                  if (set_00 != (lyxp_set *)0x0) {
                    set_free_content(set_00);
                    free(set_00);
                  }
                  local_50 = (lys_module *)CONCAT71(local_50._1_7_,1);
                  if ((short)_cStack_60 == 1) {
                    local_50 = (lys_module *)CONCAT71(local_50._1_7_,*(char *)&local_58->ctx != '*')
                    ;
                  }
                  plVar33 = local_38;
                  lVar7 = lVar23;
                  if (local_38->used != 0) {
                    plVar8 = (lys_module *)(ulong)(_cStack_60 & 0xffff);
                    plVar9 = (lys_module *)0x0;
                    plVar35 = local_58;
                    local_70 = plVar8;
                    do {
                      bVar36 = true;
                      if (((plVar33->val).nodes[(ulong)plVar9 & 0xffffffff].type == LYXP_NODE_ELEM)
                         && (plVar27 = (lyd_node *)
                                       ((plVar33->val).nodes[(ulong)plVar9 & 0xffffffff].node)->attr
                            , plVar27 != (lyd_node *)0x0)) {
                        bVar36 = false;
                        plVar22 = local_78;
                        do {
                          if ((plVar22 == (lys_module *)0x0) ||
                             (*(lys_module **)&plVar27->attr->value_type == plVar22)) {
                            if ((char)local_50 != '\0') {
                              plVar4 = plVar27->next;
                              _cStack_60 = plVar9;
                              iVar17 = strncmp((char *)plVar4,(char *)plVar35,(size_t)plVar8);
                              plVar22 = local_78;
                              plVar35 = local_58;
                              plVar33 = local_38;
                              plVar9 = _cStack_60;
                              if ((iVar17 != 0) ||
                                 (plVar8->padding2[(long)((long)&plVar4[-1].schema + 6)] != '\0'))
                              goto LAB_0017d513;
                            }
                            uVar10 = (ulong)plVar9 & 0xffffffff;
                            if (bVar36) {
                              set_insert_node(plVar33,plVar27,(plVar33->val).nodes[uVar10].pos,
                                              LYXP_NODE_ATTR,(int)plVar9 + 1);
                              plVar22 = local_78;
                              plVar35 = local_58;
                              plVar8 = local_70;
                            }
                            else {
                              (plVar33->val).nodes[uVar10].node = plVar27;
                              (plVar33->val).nodes[uVar10].type = LYXP_NODE_ATTR;
                            }
                            bVar36 = true;
                            plVar9 = (lys_module *)(ulong)((int)plVar9 + 1);
                          }
LAB_0017d513:
                          plVar27 = *(lyd_node **)&plVar27->validity;
                        } while (plVar27 != (lyd_node *)0x0);
                        bVar36 = !bVar36;
                      }
                      if (bVar36) {
                        set_remove_node(plVar33,(uint)plVar9);
                        plVar35 = local_58;
                        plVar8 = local_70;
                      }
                      lVar7 = LYXP_SET_EMPTY;
                    } while ((uint)plVar9 < plVar33->used);
                  }
                }
                else {
                  lVar7 = ~LYXP_SET_EMPTY;
                  plVar33 = local_38;
                  if (set_00 != (lyxp_set *)0x0) {
                    set_free_content(set_00);
                    free(set_00);
                    plVar33 = local_38;
                  }
                }
              }
              else {
                plVar33 = local_38;
                if (set_00 != (lyxp_set *)0x0) {
                  set_free_content(set_00);
                  free(set_00);
                  plVar33 = local_38;
                }
              }
            }
            else {
              if (lVar7 - LYXP_SET_SNODE_SET < 4) {
                puVar29 = (&PTR_anon_var_dwarf_771a3_001ced38)[lVar7 - LYXP_SET_SNODE_SET];
              }
              else {
                puVar29 = (undefined *)0x0;
              }
              pcVar13 = local_48->name;
LAB_0017d014:
              ly_vlog((ly_ctx *)**(undefined8 **)(pcVar13 + 0x30),LYE_XPATH_INOP_1,LY_VLOG_NONE,
                      (void *)0x0,"path operator",puVar29);
              lVar7 = ~LYXP_SET_EMPTY;
            }
          }
        }
      }
LAB_0017d071:
      puVar26 = local_80;
      plVar16 = local_48;
      if (lVar7 == LYXP_SET_EMPTY) {
        pcVar13 = print_token(exp->tokens[*local_80]);
        ly_log_dbg(8,"%-27s %s %s[%u]","eval_node_test",pcVar18,pcVar13,
                   (ulong)exp->expr_pos[*puVar26]);
        goto LAB_0017d0b8;
      }
    }
    else {
      if (local_88 == (lys_module *)0x0) {
        plVar28 = (ly_ctx *)0x0;
      }
      else {
        plVar28 = local_88->ctx;
      }
      ly_log(plVar28,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
             ,0x1b32);
LAB_0017c560:
      lVar7 = ~LYXP_SET_EMPTY;
      puVar26 = local_80;
      plVar16 = local_48;
    }
joined_r0x0017d0c3:
    while( true ) {
      plVar5 = local_48;
      puVar25 = local_80;
      if (lVar7 != LYXP_SET_EMPTY) {
        return lVar7;
      }
      local_48 = plVar16;
      if ((exp->used <= *local_80) || (exp->tokens[*local_80] != LYXP_TOKEN_BRACK1)) break;
      local_80 = puVar26;
      lVar7 = eval_predicate(exp,puVar25,(lyd_node *)plVar5,local_88,plVar33,options,1);
      puVar26 = local_80;
      plVar16 = local_48;
      local_48 = plVar5;
      local_80 = puVar25;
    }
LAB_0017ca6f:
    local_80 = puVar26;
    exp_idx = local_80;
    uVar6 = *puVar25;
    if (exp->used <= uVar6) {
      return 0;
    }
    if (exp->tokens[uVar6] != LYXP_TOKEN_OPERATOR_PATH) {
      return 0;
    }
    all_desc = 0;
    if (exp->tok_len[uVar6] != 1) {
      if (exp->tok_len[uVar6] != 2) {
        __assert_fail("exp->tok_len[*exp_idx] == 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                      ,0x1c06,
                      "int eval_relative_location_path(struct lyxp_expr *, uint16_t *, struct lyd_node *, struct lys_module *, int, struct lyxp_set *, int)"
                     );
      }
      all_desc = 1;
    }
    pcVar13 = print_token(LYXP_TOKEN_OPERATOR_PATH);
    set = (lyxp_set *)(ulong)exp->expr_pos[*exp_idx];
    ly_log_dbg(8,"%-27s %s %s[%u]","eval_relative_location_path",pcVar18,pcVar13);
    *exp_idx = *exp_idx + 1;
  } while( true );
}

Assistant:

static int
eval_relative_location_path(struct lyxp_expr *exp, uint16_t *exp_idx, struct lyd_node *cur_node, struct lys_module *local_mod,
                            int all_desc, struct lyxp_set *set, int options)
{
    int attr_axis, ret;

    goto step;
    do {
        /* evaluate '/' or '//' */
        if (exp->tok_len[*exp_idx] == 1) {
            all_desc = 0;
        } else {
            assert(exp->tok_len[*exp_idx] == 2);
            all_desc = 1;
        }
        LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
        ++(*exp_idx);

step:
        /* Step */
        attr_axis = 0;
        switch (exp->tokens[*exp_idx]) {
        case LYXP_TOKEN_DOT:
            /* evaluate '.' */
            if (set && (options & LYXP_SNODE_ALL)) {
                ret = moveto_snode_self(set, (struct lys_node *)cur_node, all_desc, options);
            } else {
                ret = moveto_self(set, cur_node, all_desc, options);
            }
            if (ret) {
                return ret;
            }
            LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
            ++(*exp_idx);
            break;

        case LYXP_TOKEN_DDOT:
            /* evaluate '..' */
            if (set && (options & LYXP_SNODE_ALL)) {
                ret = moveto_snode_parent(set, (struct lys_node *)cur_node, all_desc, options);
            } else {
                ret = moveto_parent(set, cur_node, all_desc, options);
            }
            if (ret) {
                return ret;
            }
            LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
            ++(*exp_idx);
            break;

        case LYXP_TOKEN_AT:
            /* evaluate '@' */
            attr_axis = 1;
            LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
            ++(*exp_idx);

            /* fall through */
        case LYXP_TOKEN_NAMETEST:
        case LYXP_TOKEN_NODETYPE:
            ret = eval_node_test(exp, exp_idx, cur_node, local_mod, attr_axis, all_desc, set, options);
            if (ret) {
                return ret;
            }

            while ((exp->used > *exp_idx) && (exp->tokens[*exp_idx] == LYXP_TOKEN_BRACK1)) {
                ret = eval_predicate(exp, exp_idx, cur_node, local_mod, set, options, 1);
                if (ret) {
                    return ret;
                }
            }
            break;

        default:
            LOGINT(local_mod ? local_mod->ctx : NULL);
            return -1;
        }
    } while ((exp->used > *exp_idx) && (exp->tokens[*exp_idx] == LYXP_TOKEN_OPERATOR_PATH));

    return EXIT_SUCCESS;
}